

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ply.cc
# Opt level: O2

void __thiscall gvr::PLYReader::readData(PLYReader *this)

{
  pointer ppPVar1;
  char cVar2;
  size_t i;
  ulong uVar3;
  
  cVar2 = std::__basic_file<char>::is_open();
  if (cVar2 != '\0') {
    for (uVar3 = 0;
        ppPVar1 = (this->list).
                  super__Vector_base<gvr::PLYElement_*,_std::allocator<gvr::PLYElement_*>_>._M_impl.
                  super__Vector_impl_data._M_start,
        uVar3 < (ulong)((long)(this->list).
                              super__Vector_base<gvr::PLYElement_*,_std::allocator<gvr::PLYElement_*>_>
                              ._M_impl.super__Vector_impl_data._M_finish - (long)ppPVar1 >> 3);
        uVar3 = uVar3 + 1) {
      PLYElement::readData(ppPVar1[uVar3],(streambuf *)&this->field_0x30);
    }
    std::ifstream::close();
    return;
  }
  return;
}

Assistant:

void PLYReader::readData()
{
  if (in.is_open())
  {
    std::streambuf *sb=in.rdbuf();

    for (size_t i=0; i<list.size(); i++)
    {
      list[i]->readData(sb);
    }

    in.close();
  }
}